

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O2

void output(gif_dest_ptr dinfo,code_int code)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  undefined6 in_register_00000032;
  
  uVar3 = (int)CONCAT62(in_register_00000032,code) << ((byte)dinfo->cur_bits & 0x3f) |
          dinfo->cur_accum;
  dinfo->cur_accum = uVar3;
  iVar2 = dinfo->cur_bits + dinfo->n_bits;
  while (dinfo->cur_bits = iVar2, 7 < iVar2) {
    iVar2 = dinfo->bytesinpkt;
    dinfo->bytesinpkt = iVar2 + 1;
    dinfo->packetbuf[(long)iVar2 + 1] = (char)uVar3;
    if (0xfe < dinfo->bytesinpkt) {
      flush_packet(dinfo);
    }
    uVar3 = dinfo->cur_accum >> 8;
    dinfo->cur_accum = uVar3;
    iVar2 = dinfo->cur_bits + -8;
  }
  if (dinfo->maxcode < dinfo->free_code) {
    iVar2 = dinfo->n_bits + 1;
    dinfo->n_bits = iVar2;
    uVar1 = 0x1000;
    if (iVar2 != 0xc) {
      uVar1 = ~(ushort)(-1 << ((byte)iVar2 & 0x1f));
    }
    dinfo->maxcode = uVar1;
  }
  return;
}

Assistant:

LOCAL(void)
output(gif_dest_ptr dinfo, code_int code)
/* Emit a code of n_bits bits */
/* Uses cur_accum and cur_bits to reblock into 8-bit bytes */
{
  dinfo->cur_accum |= ((long)code) << dinfo->cur_bits;
  dinfo->cur_bits += dinfo->n_bits;

  while (dinfo->cur_bits >= 8) {
    CHAR_OUT(dinfo, dinfo->cur_accum & 0xFF);
    dinfo->cur_accum >>= 8;
    dinfo->cur_bits -= 8;
  }

  /*
   * If the next entry is going to be too big for the code size,
   * then increase it, if possible.  We do this here to ensure
   * that it's done in sync with the decoder's codesize increases.
   */
  if (dinfo->free_code > dinfo->maxcode) {
    dinfo->n_bits++;
    if (dinfo->n_bits == MAX_LZW_BITS)
      dinfo->maxcode = LZW_TABLE_SIZE; /* free_code will never exceed this */
    else
      dinfo->maxcode = MAXCODE(dinfo->n_bits);
  }
}